

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmq.hpp
# Opt level: O0

ssize_t __thiscall
zmq::detail::socket_base::send(socket_base *this,int __fd,void *__buf,size_t __n,int __flags)

{
  void *pvVar1;
  int iVar2;
  error_t *this_00;
  size_t sVar3;
  undefined8 uVar4;
  undefined4 in_register_00000034;
  int nbytes;
  unsigned_long *in_stack_ffffffffffffff98;
  optional<unsigned_long> *in_stack_ffffffffffffffa0;
  const_buffer local_20;
  ssize_t local_10;
  
  local_20._data = (void *)CONCAT44(in_register_00000034,__fd);
  pvVar1 = this->_handle;
  local_20._size = (size_t)__buf;
  this_00 = (error_t *)const_buffer::data(&local_20);
  sVar3 = const_buffer::size(&local_20);
  iVar2 = zmq_send(pvVar1,this_00,sVar3,__n & 0xffffffff);
  if (iVar2 < 0) {
    iVar2 = zmq_errno();
    if (iVar2 != 0xb) {
      uVar4 = __cxa_allocate_exception(0x10);
      error_t::error_t(this_00);
      __cxa_throw(uVar4,&error_t::typeinfo,error_t::~error_t);
    }
    std::optional<unsigned_long>::optional((optional<unsigned_long> *)0x4d978d);
  }
  else {
    std::optional<unsigned_long>::optional<unsigned_long,_true>
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  }
  return local_10;
}

Assistant:

detail::send_result_t send(const_buffer buf, send_flags flags = send_flags::none)
    {
        const int nbytes =
          zmq_send(_handle, buf.data(), buf.size(), static_cast<int>(flags));
        if (nbytes >= 0)
            return static_cast<size_t>(nbytes);
        if (zmq_errno() == EAGAIN)
            return {};
        throw error_t();
    }